

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O0

void __thiscall NeuralNetwork::gradientDescent(NeuralNetwork *this)

{
  int *in_RDI;
  value_type *l;
  int i;
  vector<Layer,_std::allocator<Layer>_> *in_stack_ffffffffffffff80;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_ffffffffffffff98;
  MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffa0;
  float *in_stack_ffffffffffffffc0;
  MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffc8;
  int local_c;
  
  for (local_c = 0; local_c < *in_RDI + -1; local_c = local_c + 1) {
    std::vector<Layer,_std::allocator<Layer>_>::operator[]
              ((vector<Layer,_std::allocator<Layer>_> *)(in_RDI + 10),(long)local_c);
    Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator*
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator*
              ((MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
    Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator-=
              ((MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffffa0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                *)in_stack_ffffffffffffff98);
  }
  std::vector<Layer,_std::allocator<Layer>_>::back(in_stack_ffffffffffffff80);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator*
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::vector<Layer,_std::allocator<Layer>_>::back(in_stack_ffffffffffffff80);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void NeuralNetwork::gradientDescent() {
    using namespace std;
    //最后一层没有权重
    for (int i = 0; i < layerCount_ - 1; ++i) {
        auto& l = layers_[i];
        l.bias -= l.biasGrads * learningRate_;
        l.weights -= l.weightGrads * learningRate_;
    }
    this->layers_.back().bias -= this->layers_.back().biasGrads * learningRate_;
}